

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalWatcomWMakeGenerator::EnableLanguage
          (cmGlobalWatcomWMakeGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *l,cmMakefile *mf,bool optional)

{
  cmMakefile *pcVar1;
  string_view local_188;
  allocator<char> local_171;
  string local_170;
  string_view local_150;
  allocator<char> local_139;
  string local_138;
  string_view local_118;
  allocator<char> local_101;
  string local_100;
  string_view local_e0;
  allocator<char> local_c9;
  string local_c8;
  string_view local_a8;
  allocator<char> local_91;
  string local_90;
  string_view local_70 [2];
  allocator<char> local_49;
  string local_48;
  byte local_21;
  cmMakefile *pcStack_20;
  bool optional_local;
  cmMakefile *mf_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *l_local;
  cmGlobalWatcomWMakeGenerator *this_local;
  
  local_21 = optional;
  pcStack_20 = mf;
  mf_local = (cmMakefile *)l;
  l_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"WATCOM",&local_49);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_70,"1");
  cmMakefile::AddDefinition(mf,&local_48,local_70[0]);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_QUOTE_INCLUDE_PATHS",&local_91);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"1");
  cmMakefile::AddDefinition(pcVar1,&local_90,local_a8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMAKE_MANGLE_OBJECT_FILE_NAMES",&local_c9);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e0,"1");
  cmMakefile::AddDefinition(pcVar1,&local_c8,local_e0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"CMAKE_MAKE_SYMBOLIC_RULE",&local_101);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,".SYMBOLIC");
  cmMakefile::AddDefinition(pcVar1,&local_100,local_118);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"CMAKE_GENERATOR_CC",&local_139);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150,"wcl386");
  cmMakefile::AddDefinition(pcVar1,&local_138,local_150);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"CMAKE_GENERATOR_CXX",&local_171);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188,"wcl386");
  cmMakefile::AddDefinition(pcVar1,&local_170,local_188);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  cmGlobalUnixMakefileGenerator3::EnableLanguage
            (&this->super_cmGlobalUnixMakefileGenerator3,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)mf_local,pcStack_20,(bool)(local_21 & 1));
  return;
}

Assistant:

void cmGlobalWatcomWMakeGenerator::EnableLanguage(
  std::vector<std::string> const& l, cmMakefile* mf, bool optional)
{
  // pick a default
  mf->AddDefinition("WATCOM", "1");
  mf->AddDefinition("CMAKE_QUOTE_INCLUDE_PATHS", "1");
  mf->AddDefinition("CMAKE_MANGLE_OBJECT_FILE_NAMES", "1");
  mf->AddDefinition("CMAKE_MAKE_SYMBOLIC_RULE", ".SYMBOLIC");
  mf->AddDefinition("CMAKE_GENERATOR_CC", "wcl386");
  mf->AddDefinition("CMAKE_GENERATOR_CXX", "wcl386");
  this->cmGlobalUnixMakefileGenerator3::EnableLanguage(l, mf, optional);
}